

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O1

result * __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::none_observer>
::operator()(result *__return_storage_ptr__,
            solver_functor<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::none_observer>
            *this,vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *constraints,int variables,quadratic_cost_type<long_double> *original_costs,
            double cost_constant)

{
  init_policy_type iVar1;
  context *this_00;
  context *ctx;
  bool bVar2;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  rep rVar8;
  undefined8 extraout_RAX;
  long lVar9;
  result_status rVar10;
  random_engine *rng;
  int iVar11;
  bit_array_impl *x_optimistic;
  bit_array_impl *x_pessimistic;
  int in_R9D;
  long lVar12;
  ulong uVar13;
  longdouble in_ST0;
  longdouble theta;
  longdouble lVar14;
  longdouble in_ST1;
  longdouble lVar15;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar16;
  longdouble lVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 in_XMM2_Qb;
  bit_array x;
  bit_array empty_x;
  quadratic_cost_type<long_double> norm_costs;
  compute_order compute;
  solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
  slv;
  bit_array_impl local_1c0;
  uint local_1ac;
  bit_array_impl local_1a8;
  quadratic_cost_type<long_double> *local_198;
  double local_190;
  ulong local_188;
  int local_17c;
  longdouble local_178;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  longdouble local_15c;
  longdouble local_150;
  longdouble local_144;
  quadratic_cost_type<long_double> local_138;
  double local_118;
  double local_110;
  compute_order local_108;
  longdouble local_d0;
  longdouble local_c4;
  solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
  local_b8;
  
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->duration = 0.0;
  __return_storage_ptr__->loop = 0;
  __return_storage_ptr__->variables = 0;
  __return_storage_ptr__->constraints = 0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->method)._M_len = 0;
  (__return_storage_ptr__->method)._M_str = (char *)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  local_190 = cost_constant;
  bit_array_impl::bit_array_impl(&local_1c0,variables);
  this_00 = this->m_ctx;
  normalize_costs<long_double,baryonyx::itm::quadratic_cost_type<long_double>>
            (&local_138,(itm *)this_00,(context *)original_costs,
             (quadratic_cost_type<long_double> *)this->m_rng,(random_engine *)(ulong)(uint)variables
             ,in_R9D);
  local_150 = (longdouble)(this_00->parameters).kappa_step;
  local_144 = (longdouble)(this_00->parameters).kappa_max;
  local_15c = (longdouble)(this_00->parameters).alpha;
  theta = (longdouble)(this_00->parameters).theta;
  dVar19 = (this_00->parameters).delta;
  if (0.0 <= dVar19) {
    local_178 = (longdouble)dVar19;
    local_110 = dVar19;
  }
  else {
    ctx = this->m_ctx;
    lVar14 = in_ST5;
    local_b8._0_10_ = theta;
    info<>(ctx,"  - delta not defined, compute it:\n");
    quadratic_cost_type<long_double>::min(&local_138,variables);
    lVar15 = in_ST0 - (longdouble)local_b8._0_10_ * in_ST0;
    local_1a8._0_8_ = SUB108(lVar15,0);
    local_1a8.m_data._M_t.
    super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl._0_2_ =
         (undefined2)((unkuint10)lVar15 >> 0x40);
    local_108.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._0_10_
         = in_ST0;
    info<long_double,long_double,long_double>
              (ctx,"    - delta={} (min normalized cost:{} / theta: {})\n",(longdouble *)&local_1a8,
               (longdouble *)&local_108,(longdouble *)&local_b8);
    local_178 = (longdouble)
                CONCAT28(local_1a8.m_data._M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl._0_2_,
                         local_1a8._0_8_);
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = lVar14;
  }
  local_c4 = (longdouble)(this_00->parameters).pushing_k_factor;
  local_d0 = (longdouble)(this_00->parameters).pushing_objective_amplifier;
  local_188 = (ulong)(this_00->parameters).w;
  solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
  ::solver_inequalities_01coeff
            (&local_b8,this->m_rng,
             (int)((ulong)((long)(constraints->
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(constraints->
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
             variables,&local_138,constraints);
  compute_order::compute_order(&local_108,(this_00->parameters).order,variables);
  dVar19 = (this->m_ctx->parameters).init_policy_random;
  local_1a8.m_size = 0;
  local_1a8.m_block_size = 0;
  local_1a8.m_data._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl._0_2_ = 0;
  local_1a8.m_data._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl._2_6_ = 0;
  iVar1 = (this_00->parameters).init_policy;
  if (iVar1 == bastert) {
    init_with_bastert<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::minimize_tag>
              ((bit_array *)&local_1c0,original_costs,variables,0);
  }
  else {
    if (iVar1 == pessimistic_solve) {
      rng = this->m_rng;
      x_pessimistic = &local_1c0;
      x_optimistic = &local_1a8;
    }
    else {
      if (iVar1 != optimistic_solve) goto LAB_00405792;
      rng = this->m_rng;
      x_pessimistic = &local_1a8;
      x_optimistic = &local_1c0;
    }
    init_with_pre_solve<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::minimize_tag>
              ((bit_array *)x_pessimistic,(bit_array *)x_optimistic,rng,original_costs,constraints,
               1.0);
  }
LAB_00405792:
  local_198 = original_costs;
  if (local_1c0.m_size != 0) {
    iVar11 = 0;
    do {
      dVar18 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (this->m_rng);
      if (dVar18 < dVar19) {
        bit_array_impl::invert(&local_1c0,iVar11);
      }
      iVar11 = iVar11 + 1;
    } while (local_1c0.m_size != iVar11);
  }
  if ((void *)CONCAT62(local_1a8.m_data._M_t.
                       super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl._2_6_,
                       local_1a8.m_data._M_t.
                       super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl._0_2_) !=
      (void *)0x0) {
    operator_delete__((void *)CONCAT62(local_1a8.m_data._M_t.
                                       super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl.
                                       _2_6_,local_1a8.m_data._M_t.
                                             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                             .super__Head_base<0UL,_unsigned_long_*,_false>.
                                             _M_head_impl._0_2_));
  }
  dVar19 = (this_00->parameters).kappa_min;
  rVar8 = std::chrono::_V2::steady_clock::now();
  (this->m_begin).__d.__r = rVar8;
  rVar8 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = rVar8;
  compute_order::
  init<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,baryonyx::bit_array>
            (&local_108,&local_b8,(bit_array *)&local_1c0);
  lVar14 = (longdouble)dVar19;
  local_17c = variables;
  local_118 = dVar19;
  if ((this_00->parameters).limit == 0) {
    uVar5 = 0;
  }
  else {
    iVar11 = 0x7fffffff;
    lVar12 = 0;
    local_1ac = 0;
    do {
      iVar4 = compute_order::
              run<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,baryonyx::bit_array,long_double>
                        (&local_108,&local_b8,(bit_array *)&local_1c0,this->m_rng,lVar14,local_178,
                         theta);
      if (iVar4 == 0) {
        dVar19 = quadratic_cost_type<long_double>::results
                           (local_198,(bit_array *)&local_1c0,local_190);
        store_if_better(this,(bit_array *)&local_1c0,dVar19,lVar12);
        iVar11 = 0;
        local_1ac = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        bVar2 = false;
      }
      else {
        if (iVar4 < iVar11) {
          store_if_better(this,(bit_array *)&local_1c0,iVar4,lVar12);
          iVar11 = iVar4;
        }
        if ((long)local_188 < lVar12) {
          local_160 = local_b8.m;
          local_164 = iVar4;
          powl();
          lVar14 = lVar14 + local_150 * in_ST0;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
        }
        rVar10 = kappa_max_reached;
        in_ST5 = in_ST4;
        if (lVar14 <= local_144) {
          lVar9 = std::chrono::_V2::steady_clock::now();
          (this->m_end).__d.__r = lVar9;
          dVar19 = (this->m_ctx->parameters).time_limit;
          bVar2 = true;
          if ((dVar19 <= 0.0) ||
             (rVar10 = time_limit_reached, bVar2 = true,
             (double)(lVar9 - (this->m_begin).__d.__r) / 1000000000.0 <= dVar19)) goto LAB_004059bc;
        }
        __return_storage_ptr__->status = rVar10;
        bVar2 = false;
      }
LAB_004059bc:
      uVar5 = local_1ac;
    } while ((bVar2) && (lVar12 = lVar12 + 1, lVar12 != (this_00->parameters).limit));
  }
  if ((uVar5 & 1) == 0) {
    __return_storage_ptr__->status = limit_reached;
  }
  else if (0 < (this_00->parameters).pushes_limit) {
    iVar11 = 0;
    iVar4 = 0;
    do {
      lVar15 = in_ST3;
      lVar16 = in_ST3;
      iVar6 = compute_order::
              push_and_run<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,baryonyx::bit_array,long_double>
                        (&local_108,&local_b8,(bit_array *)&local_1c0,this->m_rng,local_c4 * lVar14,
                         local_178,theta,local_d0);
      if (iVar6 == 0) {
        dVar19 = quadratic_cost_type<long_double>::results
                           (local_198,(bit_array *)&local_1c0,local_190);
        store_if_better(this,(bit_array *)&local_1c0,dVar19,
                        (long)~((this_00->parameters).pushing_iteration_limit * iVar4));
      }
      lVar12 = std::chrono::_V2::steady_clock::now();
      (this->m_end).__d.__r = lVar12;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = (this->m_ctx->parameters).time_limit;
      auVar20._0_8_ = (double)(lVar12 - (this->m_begin).__d.__r) / 1000000000.0;
      auVar20._8_8_ = in_XMM2_Qb;
      uVar3 = vcmppd_avx512vl(auVar21,ZEXT816(0),6);
      uVar13 = vcmppd_avx512vl(auVar21,auVar20,1);
      uVar13 = ((byte)uVar3 & 3) & uVar13;
      local_188 = CONCAT62(local_188._2_6_,(short)uVar13);
      if (((uVar13 & 1) == 0) && (0 < (this_00->parameters).pushing_iteration_limit)) {
        iVar6 = 1;
        while (iVar7 = compute_order::
                       run<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,baryonyx::bit_array,long_double>
                                 (&local_108,&local_b8,(bit_array *)&local_1c0,this->m_rng,lVar14,
                                  local_178,theta), iVar7 != 0) {
          if ((this_00->parameters).w < (double)(iVar6 + -1)) {
            local_168 = local_b8.m;
            lVar17 = lVar16;
            local_16c = iVar7;
            powl();
            lVar14 = lVar14 + local_150 * in_ST0;
            in_ST0 = in_ST1;
            in_ST1 = in_ST2;
            in_ST2 = in_ST3;
            in_ST3 = lVar15;
            lVar15 = lVar16;
            lVar16 = lVar17;
          }
          if (local_144 < lVar14) goto LAB_00405c33;
          lVar12 = std::chrono::_V2::steady_clock::now();
          (this->m_end).__d.__r = lVar12;
          dVar19 = (this->m_ctx->parameters).time_limit;
          if (((0.0 < dVar19) &&
              (dVar19 < (double)(lVar12 - (this->m_begin).__d.__r) / 1000000000.0)) ||
             (bVar2 = (this_00->parameters).pushing_iteration_limit <= iVar6, iVar6 = iVar6 + 1,
             bVar2)) goto LAB_00405c33;
        }
        dVar19 = quadratic_cost_type<long_double>::results
                           (local_198,(bit_array *)&local_1c0,local_190);
        store_if_better(this,(bit_array *)&local_1c0,dVar19,
                        (long)((this_00->parameters).pushing_iteration_limit * iVar11 - iVar6));
      }
LAB_00405c33:
      if ((local_188 & 1) != 0) break;
      iVar4 = iVar4 + 1;
      iVar11 = iVar11 + -1;
    } while (iVar4 < (this_00->parameters).pushes_limit);
  }
  iVar11 = local_17c;
  if ((this->m_best).remaining_constraints == 0) {
    __return_storage_ptr__->status = success;
  }
  if ((this->m_best).x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    convert<baryonyx::itm::minimize_tag>
              (&this->m_best,
               (__return_storage_ptr__->solutions).
               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
               super__Vector_impl_data._M_start,iVar11);
  }
  if (local_108.m_order.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.m_order.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_108.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_108.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
  ::~solver_inequalities_01coeff(&local_b8);
  if ((__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
      local_138.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl != (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0) {
    operator_delete__((void *)local_138.indices._M_t.
                              super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl);
  }
  local_138.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                 (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0;
  if ((tuple<baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
       )local_138.quadratic_elements._M_t.
        super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
        .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_false>.
        _M_head_impl !=
      (_Head_base<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_false>)0x0) {
    operator_delete__((void *)local_138.quadratic_elements._M_t.
                              super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
                              .
                              super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_false>
                              ._M_head_impl);
  }
  local_138.quadratic_elements._M_t.
  super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
  .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_false>.
  _M_head_impl = (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>,_true,_true>
                  )(__uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
                    )0x0;
  if ((_Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>)
      local_138.linear_elements._M_t.
      super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
      super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
      super__Head_base<0UL,_long_double_*,_false>._M_head_impl != (longdouble *)0x0) {
    operator_delete__((void *)local_138.linear_elements._M_t.
                              super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>
                              .super__Head_base<0UL,_long_double_*,_false>._M_head_impl);
  }
  if ((_Head_base<0UL,_unsigned_long_*,_false>)
      local_1c0.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
    operator_delete__((void *)local_1c0.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator()(const std::vector<merged_constraint>& constraints,
                      int variables,
                      const Cost& original_costs,
                      double cost_constant)
    {
        result r;

        bit_array x(variables);

        int best_remaining = INT_MAX;

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const long int w_limit = static_cast<long int>(p.w);

        Solver slv(
          m_rng, length(constraints), variables, norm_costs, constraints);

        compute_order compute(p.order, variables);

        {
            std::bernoulli_distribution choose_mutation(
              m_ctx.parameters.init_policy_random);
            bit_array empty_x;

            switch (p.init_policy) {
            case solver_parameters::init_policy_type::pessimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  x, empty_x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::optimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  empty_x, x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::bastert:
                init_with_bastert<Cost, Mode>(x, original_costs, variables, 0);
                break;
            }

            for (int i = 0, e = x.size(); i != e; ++i)
                if (choose_mutation(m_rng))
                    x.invert(i);
        }

        bool start_push = false;
        auto kappa = static_cast<Float>(p.kappa_min);

        Observer obs("img", slv.m, slv.n, p.limit);

        m_begin = std::chrono::steady_clock::now();
        m_end = std::chrono::steady_clock::now();

        compute.init(slv, x);

        for (long int i = 0; i != p.limit; ++i) {
            auto remaining = compute.run(slv, x, m_rng, kappa, delta, theta);
            obs.make_observation(slv.ap, slv.P.get(), slv.pi.get());

            if (remaining == 0) {
                store_if_better(
                  x, original_costs.results(x, cost_constant), i);
                best_remaining = remaining;
                start_push = true;
                break;
            }

            if (remaining < best_remaining) {
                store_if_better(x, remaining, i);
                best_remaining = remaining;
            }

            if (i > w_limit)
                kappa += kappa_step * std::pow(static_cast<Float>(remaining) /
                                                 static_cast<Float>(slv.m),
                                               alpha);

            if (kappa > kappa_max) {
                r.status = result_status::kappa_max_reached;
                break;
            }

            if (is_timelimit_reached()) {
                r.status = result_status::time_limit_reached;
                break;
            }
        }

        if (!start_push) {
            r.status = result_status::limit_reached;
        } else {
            for (int push = 0; push < p.pushes_limit; ++push) {
                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_rng,
                                       pushing_k_factor * kappa,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0)
                    store_if_better(x,
                                    original_costs.results(x, cost_constant),
                                    -push * p.pushing_iteration_limit - 1);

                if (is_timelimit_reached())
                    break;

                for (int iter = 0; iter < p.pushing_iteration_limit; ++iter) {
                    remaining =
                      compute.run(slv, x, m_rng, kappa, delta, theta);

                    if (remaining == 0) {
                        store_if_better(
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;

                    if (is_timelimit_reached())
                        break;
                }
            }
        }

        if (m_best.remaining_constraints == 0)
            r.status = result_status::success;

        if (!m_best.x.empty()) {
            r.solutions.resize(1);
            convert(m_best, r.solutions[0], variables);
        }

        return r;
    }